

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

void __thiscall
iDynTree::KinDynComputations::KinDynComputationsPrivateAttributes::
processOnLeftSideBodyFixedBaseMomentumJacobian
          (KinDynComputationsPrivateAttributes *this,MatrixView<double> *jac)

{
  double *pdVar1;
  ulong uVar2;
  Index row_1;
  Rotation *pRVar3;
  Transform *this_00;
  long lVar4;
  double *pdVar5;
  pointer peVar6;
  Index dstCols;
  long cols;
  ActualDstType actualDst;
  double *pdVar7;
  element_type *peVar8;
  Index inner;
  long lVar9;
  Index col;
  long lVar10;
  pointer peVar11;
  ulong uVar12;
  index_type iVar13;
  Transform newOutputFrame_X_oldOutputFrame;
  Matrix6x6 newOutputFrame_X_oldOutputFrame_;
  PlainObjectBase<Eigen::Matrix<double,_6,__1,_0,_6,__1>_> local_1d8 [2];
  element_type *local_1b8;
  Transform local_1b0 [96];
  Transform local_150 [40];
  double local_128 [31];
  
  iDynTree::Transform::Transform(local_1b0);
  if (this->m_frameVelRepr != BODY_FIXED_REPRESENTATION) {
    if (this->m_frameVelRepr == MIXED_REPRESENTATION) {
      iDynTree::FreeFloatingPos::worldBasePos();
      pRVar3 = (Rotation *)iDynTree::Transform::getRotation();
      iDynTree::Position::Zero();
      this_00 = local_150;
      iDynTree::Transform::Transform(this_00,pRVar3,(Position *)local_1d8);
    }
    else {
      this_00 = (Transform *)iDynTree::FreeFloatingPos::worldBasePos();
    }
    iDynTree::Transform::operator=(local_1b0,this_00);
    iDynTree::Transform::asAdjointTransformWrench();
    uVar2 = jac->m_cols;
    if (jac->m_storageOrder == ColumnMajor) {
      iVar13 = jac->m_rows;
      uVar12 = 1;
    }
    else {
      iVar13 = 1;
      uVar12 = uVar2;
    }
    peVar11 = jac->m_storage;
    cols = (long)(int)uVar2;
    local_1d8[0].m_storage.m_data = (element_type *)0x0;
    local_1d8[0].m_storage.m_cols = 0;
    if ((uVar2 & 0xffffffff) != 0) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>_>::resize(local_1d8,6,cols);
      lVar4 = cols;
      if (local_1d8[0].m_storage.m_cols != cols) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>_>::resize(local_1d8,6,cols);
        lVar4 = local_1d8[0].m_storage.m_cols;
      }
      if (0 < lVar4) {
        lVar10 = 0;
        local_1b8 = local_1d8[0].m_storage.m_data;
        pdVar5 = local_1d8[0].m_storage.m_data;
        do {
          pdVar1 = peVar11 + lVar10 * iVar13;
          lVar9 = 0;
          pdVar7 = local_128;
          do {
            pdVar5[lVar9] =
                 pdVar1[uVar12 * 5] * *pdVar7 + pdVar1[uVar12 * 4] * pdVar7[-1] +
                 pdVar1[uVar12 * 3] * pdVar7[-2] +
                 pdVar1[uVar12 * 2] * pdVar7[-3] + pdVar1[uVar12] * pdVar7[-4] +
                 *pdVar1 * pdVar7[-5];
            lVar9 = lVar9 + 1;
            pdVar7 = pdVar7 + 6;
          } while (lVar9 != 6);
          lVar10 = lVar10 + 1;
          pdVar5 = pdVar5 + 6;
        } while (lVar10 != lVar4);
      }
    }
    lVar4 = 0;
    pdVar5 = local_1d8[0].m_storage.m_data;
    do {
      peVar6 = peVar11;
      peVar8 = pdVar5;
      lVar10 = cols;
      if (0 < cols) {
        do {
          *peVar6 = *peVar8;
          peVar8 = peVar8 + 6;
          peVar6 = peVar6 + iVar13;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 1;
      peVar11 = peVar11 + uVar12;
    } while (lVar4 != 6);
    free(local_1d8[0].m_storage.m_data);
  }
  return;
}

Assistant:

void KinDynComputations::KinDynComputationsPrivateAttributes::processOnLeftSideBodyFixedBaseMomentumJacobian(MatrixView<double> jac)
{
    Transform newOutputFrame_X_oldOutputFrame;
    if (m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        return;
    }
    else if (m_frameVelRepr == MIXED_REPRESENTATION)
    {
        Transform & world_X_base = m_pos.worldBasePos();
        newOutputFrame_X_oldOutputFrame = Transform(world_X_base.getRotation(),Position::Zero());
    }
    else
    {
        assert(m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        newOutputFrame_X_oldOutputFrame = m_pos.worldBasePos();
    }

    Matrix6x6 newOutputFrame_X_oldOutputFrame_ = newOutputFrame_X_oldOutputFrame.asAdjointTransformWrench();

    int cols = jac.cols();
    toEigen(jac).block(0,0,6,cols) = toEigen(newOutputFrame_X_oldOutputFrame_)*toEigen(jac).block(0,0,6,cols);
}